

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68040_move16_al_pi(m68k_info *info)

{
  int data [2];
  int modes [2];
  uint local_18;
  uint local_14;
  int local_10 [2];
  
  local_18 = read_imm_32(info);
  local_14 = info->ir & 7;
  local_10[0] = 0x11;
  local_10[1] = 4;
  if ((info->type & 0x10) == 0) {
    d68000_invalid(info);
    return;
  }
  build_move16(info,(int *)&local_18,local_10);
  return;
}

Assistant:

static void d68040_move16_al_pi(m68k_info *info)
{
	int data[] = { read_imm_32(info), info->ir & 7 };
	int modes[] = { M68K_AM_ABSOLUTE_DATA_LONG, M68K_AM_REGI_ADDR_POST_INC };

	LIMIT_CPU_TYPES(info, M68040_PLUS);

	build_move16(info, data, modes);
}